

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist.hpp
# Opt level: O0

vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
mnist::read_images(string *filename)

{
  bool bVar1;
  byte bVar2;
  runtime_error *this;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *in_RDI;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> images_u8;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
  *in_stack_000001b8;
  string *in_stack_000001c0;
  path *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
  *in_stack_ffffffffffffff88;
  format in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  path *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __lhs = &local_38;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
  bVar1 = pico_tree::std::filesystem::exists(in_stack_ffffffffffffff40);
  bVar2 = bVar1 ^ 0xff;
  pico_tree::std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff40);
  if ((bVar2 & 1) == 0) {
    pico_tree::std::
    vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::vector
              ((vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                *)0x1049e7);
    pico_tree::read_mnist_images(in_stack_000001c0,in_stack_000001b8);
    cast<float,std::byte,784ul>(in_stack_ffffffffffffff88);
    pico_tree::std::
    vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::~vector
              ((vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                *)CONCAT17(bVar2,in_stack_ffffffffffffff50));
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(__lhs,(char *)in_RDI);
  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffff98);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::vector<image_float> read_images(std::string const& filename) {
    if (!std::filesystem::exists(filename)) {
      throw std::runtime_error(filename + " doesn't exist");
    }

    std::vector<image_byte> images_u8;
    pico_tree::read_mnist_images(filename, images_u8);
    return cast<scalar_type>(images_u8);
  }